

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O1

vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
* __thiscall
optimization::loop_unrolling::Rewriter::get_insts
          (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *__return_storage_ptr__,Rewriter *this,int times,VarId *new_change_var)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  pointer puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Base_ptr p_Var5;
  Inst *pIVar6;
  BasicBlk *pBVar7;
  int iVar8;
  undefined4 extraout_var;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  _Var9;
  uint32_t *puVar10;
  mapped_type *pmVar11;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var12;
  size_type sVar13;
  _Base_ptr p_Var14;
  long lVar15;
  _Rb_tree_header *p_Var16;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var17;
  _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
  *this_00;
  Inst *pIVar18;
  pointer puVar19;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> ptr_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> ptr;
  VarId var;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_100;
  uint32_t local_f4;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_f0;
  int local_e4;
  _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
  *local_e0;
  int local_d4;
  uint32_t local_d0;
  uint32_t local_cc;
  VarId *local_c8;
  undefined1 local_c0 [24];
  _Rb_tree_node_base *local_a8;
  _Base_ptr local_90;
  undefined **local_88;
  Displayable local_80;
  pointer local_78;
  undefined **local_70;
  uint32_t local_68;
  undefined **local_60;
  uint local_58;
  key_type local_50;
  undefined **local_40;
  uint32_t local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)__return_storage_ptr__;
  local_d4 = times;
  local_c8 = new_change_var;
  if (times < 1) {
    local_f4 = 0;
  }
  else {
    this_00 = (_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
               *)&this->var_map;
    local_90 = (_Base_ptr)&this->phi_var_pair;
    p_Var1 = &(this->var_map)._M_t._M_impl.super__Rb_tree_header;
    local_80._vptr_Displayable = (_func_int **)&this->change_var;
    local_88 = &PTR_display_001f03d8;
    iVar8 = 0;
    local_f4 = 0;
    local_e0 = this_00;
    do {
      std::
      _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
      ::clear((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               *)this_00);
      local_e4 = iVar8;
      if (iVar8 != 0) {
        std::
        _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
        ::_M_emplace_unique<std::pair<mir::inst::VarId,mir::inst::VarId>&>
                  (this_00,(pair<mir::inst::VarId,_mir::inst::VarId> *)local_90);
      }
      puVar3 = (this->blk->inst).
               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar19 = (this->blk->inst).
                     super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar3;
          puVar19 = puVar19 + 1) {
        iVar8 = (*(((puVar19->_M_t).
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                  super_Displayable)._vptr_Displayable[1])();
        if (iVar8 != 4) {
          local_40 = &PTR_display_001ee058;
          local_38 = (((puVar19->_M_t).
                       super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                       .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id;
          copy_var((Rewriter *)local_c0,(VarId *)this);
        }
      }
      puVar19 = (this->blk->inst).
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_78 = (this->blk->inst).
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar19 != local_78) {
        do {
          iVar8 = (*(((puVar19->_M_t).
                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                    super_Displayable)._vptr_Displayable[1])();
          if (iVar8 == 7) {
            if (local_e4 == 0) {
              local_c0._0_4_ =
                   (*(((puVar19->_M_t).
                       super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                       .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                     super_Displayable)._vptr_Displayable[6])();
              local_c0._4_4_ = extraout_var;
              _Var17._M_head_impl = (Inst *)local_c0._0_8_;
              if (*(undefined ***)local_c0._0_8_ != local_88) {
                _Var17._M_head_impl = (Inst *)0x0;
              }
              _Var9 = std::
                      __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                                ((((shared_ptr<mir::types::FunctionTy> *)
                                  ((long)_Var17._M_head_impl + 0x28))->
                                 super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr,((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                          ((long)_Var17._M_head_impl + 0x30))->_M_pi,
                                 local_80._vptr_Displayable);
              this_00 = local_e0;
              p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)_Var17._M_head_impl + 0x30))->_M_pi;
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(_Var9._M_current + 1) != p_Var4)
                 && (lVar15 = (long)p_Var4 - (long)(_Var9._M_current + 1) >> 4, 0 < lVar15)) {
                lVar15 = lVar15 + 1;
                puVar10 = &_Var9._M_current[1].id;
                do {
                  puVar10[-4] = *puVar10;
                  lVar15 = lVar15 + -1;
                  puVar10 = puVar10 + 4;
                } while (1 < lVar15);
              }
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)_Var17._M_head_impl + 0x30))->
              _M_pi = p_Var4 + -1;
              pmVar11 = std::
                        map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                        ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                              *)local_e0,(key_type *)(local_c0._0_8_ + 8));
              *(uint32_t *)(local_c0._0_8_ + 0x10) = pmVar11->id;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_f0,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   *)local_c0);
              _Var17._M_head_impl = (Inst *)local_c0._0_8_;
              goto LAB_0015816f;
            }
          }
          else {
            iVar8 = (*(((puVar19->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                      super_Displayable)._vptr_Displayable[6])();
            local_100._M_head_impl = (Inst *)CONCAT44(extraout_var_00,iVar8);
            uVar2 = (((puVar19->_M_t).
                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id;
            local_cc = (this->change_var).id;
            (*(((MirFunction *)local_100._M_head_impl)->super_Displayable)._vptr_Displayable[2])
                      (local_c0,local_100._M_head_impl);
            local_d0 = uVar2;
            for (p_Var12 = local_a8; _Var17._M_head_impl = local_100._M_head_impl,
                p_Var12 != (_Rb_tree_node_base *)(local_c0 + 8);
                p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
              local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
              local_50.id = *(uint32_t *)&p_Var12[1]._M_parent;
              p_Var5 = (this->var_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var14 = &p_Var1->_M_header;
              for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
                  p_Var5 = (&p_Var5->_M_left)[*(uint *)((long)(p_Var5 + 1) + 8) < local_50.id]) {
                if (*(uint *)((long)(p_Var5 + 1) + 8) >= local_50.id) {
                  p_Var14 = p_Var5;
                }
              }
              p_Var16 = p_Var1;
              if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
                 (p_Var16 = (_Rb_tree_header *)p_Var14,
                 local_50.id < *(uint *)((long)p_Var14 + 0x28))) {
                p_Var16 = p_Var1;
              }
              if (p_Var16 != p_Var1) {
                local_60 = &PTR_display_001ee058;
                local_58 = local_50.id;
                pmVar11 = std::
                          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                          ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                *)local_e0,&local_50);
                local_70 = &PTR_display_001ee058;
                local_68 = pmVar11->id;
                (*((_Var17._M_head_impl)->super_Displayable)._vptr_Displayable[3])
                          (_Var17._M_head_impl,&local_60,&local_70);
              }
            }
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)local_c0);
            this_00 = local_e0;
            sVar13 = std::
                     map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                     ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                              *)local_e0,(key_type *)&(local_100._M_head_impl)->dest);
            if (sVar13 != 0) {
              pmVar11 = std::
                        map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                        ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                              *)this_00,(key_type *)&(local_100._M_head_impl)->dest);
              *(uint32_t *)&((string *)&(local_100._M_head_impl)->dest)->_M_string_length =
                   pmVar11->id;
            }
            if (local_d0 == local_cc) {
              local_c8->id = (uint32_t)((string *)&(local_100._M_head_impl)->dest)->_M_string_length
              ;
              (this->phi_var_pair).second.id =
                   (uint32_t)((string *)&(local_100._M_head_impl)->dest)->_M_string_length;
            }
            iVar8 = (*(((puVar19->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                      super_Displayable)._vptr_Displayable[1])();
            if ((iVar8 == 1) &&
               ((puVar19->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl[3].dest.id == 7)) {
              local_f4 = (uint32_t)((string *)&(local_100._M_head_impl)->dest)->_M_string_length;
            }
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_f0,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)&local_100);
            _Var17._M_head_impl = local_100._M_head_impl;
LAB_0015816f:
            if ((_Head_base<0UL,_mir::inst::Inst_*,_false>)_Var17._M_head_impl !=
                (_Head_base<0UL,_mir::inst::Inst_*,_false>)0x0) {
              (*((_Var17._M_head_impl)->super_Displayable)._vptr_Displayable[5])();
            }
          }
          puVar19 = puVar19 + 1;
        } while (puVar19 != local_78);
      }
      iVar8 = local_e4 + 1;
    } while (iVar8 != local_d4);
  }
  puVar19 = *(pointer *)local_f0;
  if (*(pointer *)(local_f0 + 8) != puVar19) {
    iVar8 = (*(((puVar19->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
              _vptr_Displayable[1])();
    if (iVar8 != 7) {
      __assert_fail("inst->inst_kind() == mir::inst::InstKind::Phi",
                    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
                    ,0x5d,
                    "std::vector<std::unique_ptr<mir::inst::Inst>> optimization::loop_unrolling::Rewriter::get_insts(int, mir::inst::VarId &)"
                   );
    }
    pIVar6 = (puVar19->_M_t).
             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
             super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
    pIVar18 = (Inst *)0x0;
    if ((pIVar6->super_Displayable)._vptr_Displayable == (_func_int **)&PTR_display_001f03d8) {
      pIVar18 = pIVar6;
    }
    local_c0._8_4_ = local_c8->id;
    local_c0._0_8_ = &PTR_display_001ee058;
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::emplace_back<mir::inst::VarId>
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&pIVar18[1].dest.id,
               (VarId *)local_c0);
  }
  pBVar7 = this->blk;
  if ((pBVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
    (pBVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = local_f4;
  }
  else {
    (pBVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
    _vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    (pBVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = local_f4;
    (pBVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
  }
  return (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          *)local_f0;
}

Assistant:

std::vector<std::unique_ptr<mir::inst::Inst>> get_insts(
      int times, mir::inst::VarId& new_change_var) {
    std::vector<std::unique_ptr<mir::inst::Inst>> res;
    auto cond = mir::inst::VarId(0);
    for (int i = 0; i < times; i++) {
      var_map.clear();
      if (i) {
        var_map.insert(phi_var_pair);
      }
      for (auto& inst : blk.inst) {
        if (inst->inst_kind() != mir::inst::InstKind::Store) {
          copy_var(inst->dest);
        }
      }
      for (auto& inst : blk.inst) {
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          if (i == 0) {
            auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
            auto& i = *ptr;
            auto phi = dynamic_cast<mir::inst::PhiInst*>(&i);
            phi->vars.erase(
                std::find(phi->vars.begin(), phi->vars.end(), change_var));
            ptr->dest = var_map.at(ptr->dest);
            res.push_back(std::move(ptr));
          }
          continue;
        } else {
          auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
          bool flag = inst->dest == change_var;
          for (auto var : ptr->useVars()) {
            if (var_map.count(var)) ptr->replace(var, var_map.at(var));
          }
          if (var_map.count(ptr->dest)) {
            ptr->dest = var_map.at(ptr->dest);
          }
          if (flag) {
            new_change_var = ptr->dest;
            phi_var_pair.second = ptr->dest;
          }
          if (inst->inst_kind() == mir::inst::InstKind::Op) {
            auto& i = *inst;
            auto opist = dynamic_cast<mir::inst::OpInst*>(&i);
            if (opist->op == mir::inst::Op::Lt) {
              cond = ptr->dest;
            }
          }
          res.push_back(std::move(ptr));
        }
      }
    }
    if (res.size()) {
      auto& inst = res.front();
      assert(inst->inst_kind() == mir::inst::InstKind::Phi);
      auto& i = *inst;
      auto phi = dynamic_cast<mir::inst::PhiInst*>(&i);
      phi->vars.push_back(mir::inst::VarId(new_change_var.id));
    }
    blk.jump.cond_or_ret = cond;
    return res;
  }